

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webserver.c
# Opt level: O0

int web_server_set_alias
              (char *alias_name,char *alias_content,size_t alias_content_length,time_t last_modified
              )

{
  int iVar1;
  undefined1 local_88 [8];
  xml_alias_t alias;
  int ret_code;
  time_t last_modified_local;
  size_t alias_content_length_local;
  char *alias_content_local;
  char *alias_name_local;
  
  alias_release(&gAliasDoc);
  if (alias_name == (char *)0x0) {
    alias_name_local._4_4_ = 0;
  }
  else {
    if (alias_content == (char *)0x0) {
      __assert_fail("alias_content != NULL",".upnp/src/genlib/net/http/webserver.c",0x1b5,
                    "int web_server_set_alias(const char *, const char *, size_t, time_t)");
    }
    membuffer_init((membuffer *)&alias.name.size_inc);
    membuffer_init((membuffer *)local_88);
    alias.last_modified = 0;
    if (((*alias_name == '/') ||
        (iVar1 = membuffer_assign_str((membuffer *)local_88,"/"), iVar1 == 0)) &&
       (alias.ct._4_4_ = membuffer_append_str((membuffer *)local_88,alias_name), alias.ct._4_4_ == 0
       )) {
      alias.last_modified = (time_t)malloc(4);
      if ((undefined4 *)alias.last_modified != (undefined4 *)0x0) {
        *(undefined4 *)alias.last_modified = 1;
        membuffer_attach((membuffer *)&alias.name.size_inc,alias_content,alias_content_length);
        alias.doc.size_inc = last_modified;
        pthread_mutex_lock((pthread_mutex_t *)&gWebMutex);
        memcpy(&gAliasDoc,local_88,0x50);
        pthread_mutex_unlock((pthread_mutex_t *)&gWebMutex);
        return 0;
      }
      alias.last_modified = 0;
    }
    membuffer_destroy((membuffer *)local_88);
    membuffer_destroy((membuffer *)&alias.name.size_inc);
    free((void *)alias.last_modified);
    alias_name_local._4_4_ = -0x68;
  }
  return alias_name_local._4_4_;
}

Assistant:

int web_server_set_alias(const char *alias_name,
	const char *alias_content,
	size_t alias_content_length,
	time_t last_modified)
{
	int ret_code;
	struct xml_alias_t alias;

	alias_release(&gAliasDoc);
	if (alias_name == NULL) {
		/* don't serve aliased doc anymore */
		return 0;
	}
	assert(alias_content != NULL);
	membuffer_init(&alias.doc);
	membuffer_init(&alias.name);
	alias.ct = NULL;
	do {
		/* insert leading /, if missing */
		if (*alias_name != '/')
			if (membuffer_assign_str(&alias.name, "/") != 0)
				break; /* error; out of mem */
		ret_code = membuffer_append_str(&alias.name, alias_name);
		if (ret_code != 0)
			break; /* error */
		if ((alias.ct = (int *)malloc(sizeof(int))) == NULL)
			break; /* error */
		*alias.ct = 1;
		membuffer_attach(&alias.doc,
			(char *)alias_content,
			alias_content_length);
		alias.last_modified = last_modified;
		/* save in module var */
		ithread_mutex_lock(&gWebMutex);
		gAliasDoc = alias;
		ithread_mutex_unlock(&gWebMutex);

		return 0;
	} while (0);
	/* error handler */
	/* free temp alias */
	membuffer_destroy(&alias.name);
	membuffer_destroy(&alias.doc);
	free(alias.ct);

	return UPNP_E_OUTOF_MEMORY;
}